

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodePredicateOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  void *Decoder_local;
  uint64_t Address_local;
  uint Val_local;
  MCInst *Inst_local;
  
  if (Val == 0xf) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    uVar1 = MCInst_getOpcode(Inst);
    if ((uVar1 == 0xa98) && (Val == 0xe)) {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
    else {
      MCOperand_CreateImm0(Inst,(ulong)Val);
      if (Val == 0xe) {
        MCOperand_CreateReg0(Inst,0);
      }
      else {
        MCOperand_CreateReg0(Inst,3);
      }
      Inst_local._4_4_ = MCDisassembler_Success;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodePredicateOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	if (Val == 0xF) return MCDisassembler_Fail;
	// AL predicate is not allowed on Thumb1 branches.
	if (MCInst_getOpcode(Inst) == ARM_tBcc && Val == 0xE)
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, Val);
	if (Val == ARMCC_AL) {
		MCOperand_CreateReg0(Inst, 0);
	} else
		MCOperand_CreateReg0(Inst, ARM_CPSR);
	return MCDisassembler_Success;
}